

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O3

int If_CluCheckNonDisjointGroup(word *pF,int nVars,int *V2P,int *P2V,If_Grp_t *g)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  word pCofs [2] [1024];
  word local_4038 [1024];
  word local_2038 [1025];
  
  if (((byte)(g->nMyu - 3U) < 2) && ('\0' < g->nVars)) {
    lVar4 = 0;
    do {
      If_CluCofactors(pF,nVars,V2P[g->pVars[lVar4]],local_4038,local_2038);
      iVar2 = If_CluCountCofs(local_4038,nVars,(int)g->nVars,0,(word (*) [256])0x0);
      if ((iVar2 < 3) &&
         (iVar2 = If_CluCountCofs(local_2038,nVars,(int)g->nVars,0,(word (*) [256])0x0), iVar2 < 3))
      {
        If_CluMoveVar(pF,nVars,V2P,P2V,(int)g->pVars[lVar4],nVars + -1);
        cVar1 = g->nVars;
        if ('\0' < cVar1) {
          uVar3 = 0;
          do {
            g->pVars[uVar3] = (char)P2V[(nVars - cVar1) + (int)uVar3];
            uVar3 = uVar3 + 1;
          } while ((uint)(int)cVar1 != uVar3);
        }
        return 1;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < g->nVars);
  }
  return 0;
}

Assistant:

int If_CluCheckNonDisjointGroup( word * pF, int nVars, int * V2P, int * P2V, If_Grp_t * g )
{
    int v, i, nCofsBest2;
    if ( (g->nMyu == 3 || g->nMyu == 4) )
    {
        word pCofs[2][CLU_WRD_MAX];
        // try cofactoring w.r.t. each variable
        for ( v = 0; v < g->nVars; v++ )
        {
            If_CluCofactors( pF, nVars, V2P[(int)g->pVars[v]], pCofs[0], pCofs[1] );
            nCofsBest2 = If_CluCountCofs( pCofs[0], nVars, g->nVars, 0, NULL );
            if ( nCofsBest2 > 2 )
                continue;
            nCofsBest2 = If_CluCountCofs( pCofs[1], nVars, g->nVars, 0, NULL );
            if ( nCofsBest2 > 2 )
                continue;
            // found good shared variable - move to the end
            If_CluMoveVar( pF, nVars, V2P, P2V, g->pVars[v], nVars-1 );
            for ( i = 0; i < g->nVars; i++ )
                g->pVars[i] = P2V[nVars-g->nVars+i];
            return 1;
        }
    }
    return 0;
}